

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfsbfs.cpp
# Opt level: O1

void calculate_diameter(void)

{
  vector<int,std::allocator<int>> *pvVar1;
  uint uVar2;
  iterator iVar3;
  pointer piVar4;
  pointer piVar5;
  uint uVar6;
  int iVar7;
  long *plVar8;
  ostream *poVar9;
  ulong uVar10;
  mapped_type *pmVar11;
  int iVar12;
  pointer piVar13;
  key_type *pkVar14;
  int iVar15;
  ulong uVar16;
  int iVar17;
  long lVar18;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  farthest_path;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  max_path;
  vector<int,_std::allocator<int>_> path;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  distribution;
  int local_f0;
  int local_ec;
  undefined8 local_e8;
  allocator_type local_d9;
  int *local_d8;
  iterator iStack_d0;
  int *local_c8;
  vector<int,_std::allocator<int>_> local_b8;
  double local_98;
  double local_90;
  value_type local_88;
  vector<int,_std::allocator<int>_> local_68;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_48;
  
  freopen("diameter.txt","w",_stdout);
  local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector(&local_48,(long)V,&local_88,(allocator_type *)&local_d8);
  if (local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  uVar16 = 0;
  local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  local_c8 = (int *)0x0;
  local_d8 = (int *)0x0;
  iStack_d0._M_current = (int *)0x0;
  local_ec = 0;
  if (V < 1) {
    local_98 = 0.0;
    local_90 = 0.0;
  }
  else {
    local_90 = 0.0;
    uVar16 = 0;
    local_98 = 0.0;
    do {
      local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)((ulong)local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start & 0xffffffff00000000);
      std::vector<int,_std::allocator<int>_>::vector
                (&local_b8,(long)V,(value_type_conflict *)&local_68,(allocator_type *)&local_f0);
      local_f0 = -1;
      std::vector<int,_std::allocator<int>_>::vector
                (&local_68,(long)V,(value_type_conflict *)&local_f0,&local_d9);
      _DAT_001193a0 = (anonymous_namespace)::usedbfs;
      _DAT_001193a8 = 0;
      std::vector<bool,_std::allocator<bool>_>::resize
                ((vector<bool,_std::allocator<bool>_> *)&(anonymous_namespace)::usedbfs,(long)V,
                 false);
      bfs(local_ec,&local_b8,&local_68);
      local_f0 = 0;
      if (V < 1) {
        local_e8 = (ulong)local_e8._4_4_ << 0x20;
      }
      else {
        local_e8 = (ulong)local_e8._4_4_ << 0x20;
        do {
          piVar5 = local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          piVar4 = local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          uVar2 = local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[local_f0];
          uVar6 = (uint)local_e8;
          if ((int)(uint)local_e8 < (int)uVar2) {
            uVar6 = uVar2;
          }
          local_e8 = CONCAT44(local_e8._4_4_,uVar6);
          if ((int)(uint)uVar16 < (int)uVar2) {
            if (iStack_d0._M_current != local_d8) {
              iStack_d0._M_current = local_d8;
            }
            piVar13 = local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start;
            if (local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish !=
                local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start) {
              do {
                if (*(void **)piVar13 != (void *)0x0) {
                  operator_delete(*(void **)piVar13);
                }
                piVar13 = piVar13 + 6;
              } while (piVar13 != piVar5);
              local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_finish = piVar4;
            }
            std::
            vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            ::push_back((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                         *)&local_88,&local_68);
            if (iStack_d0._M_current == local_c8) {
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        ((vector<int,std::allocator<int>> *)&local_d8,iStack_d0,&local_f0);
              uVar16 = (ulong)uVar2;
            }
            else {
              *iStack_d0._M_current = local_f0;
              uVar16 = (ulong)uVar2;
LAB_00111a02:
              iStack_d0._M_current = iStack_d0._M_current + 1;
            }
          }
          else if (uVar2 == (uint)uVar16) {
            std::
            vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            ::push_back((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                         *)&local_88,&local_68);
            if (iStack_d0._M_current != local_c8) {
              *iStack_d0._M_current = local_f0;
              goto LAB_00111a02;
            }
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      ((vector<int,std::allocator<int>> *)&local_d8,iStack_d0,&local_f0);
          }
          local_90 = local_90 + (double)(int)uVar2;
          local_f0 = local_f0 + 1;
        } while (local_f0 < V);
      }
      pvVar1 = (vector<int,std::allocator<int>> *)
               (local_48.
                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start + (local_e8 & 0xffffffff));
      iVar3._M_current = *(int **)(pvVar1 + 8);
      if (iVar3._M_current == *(int **)(pvVar1 + 0x10)) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>(pvVar1,iVar3,&local_ec);
      }
      else {
        *iVar3._M_current = local_ec;
        *(int **)(pvVar1 + 8) = iVar3._M_current + 1;
      }
      if (local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      local_98 = local_98 + (double)(int)(uint)local_e8;
      local_ec = local_ec + 1;
    } while (local_ec < V);
  }
  iVar7 = V;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Diameter: ",10);
  plVar8 = (long *)std::ostream::operator<<((ostream *)&std::cout,(int)uVar16);
  std::ios::widen((char)*(undefined8 *)(*plVar8 + -0x18) + (char)plVar8);
  std::ostream::put((char)plVar8);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Average path: ",0xe);
  poVar9 = std::ostream::_M_insert<double>(local_90 / (double)(iVar7 * iVar7));
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
  std::ostream::put((char)poVar9);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Average farthest path: ",0x17);
  poVar9 = std::ostream::_M_insert<double>(local_98 / (double)iVar7);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
  std::ostream::put((char)poVar9);
  std::ostream::flush();
  local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_e8 = uVar16;
  if (iStack_d0._M_current != local_d8) {
    uVar16 = 0;
    do {
      local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      std::
      vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>
      ::emplace_back<std::vector<int,std::allocator<int>>>
                ((vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>
                  *)&local_b8,&local_68);
      if (local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      iVar7 = local_d8[uVar16];
      while( true ) {
        local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)CONCAT44(local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start._4_4_,iVar7);
        if (iVar7 == -1) break;
        pvVar1 = (vector<int,std::allocator<int>> *)
                 (local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start + uVar16 * 6);
        iVar3._M_current = *(int **)(pvVar1 + 8);
        if (iVar3._M_current == *(int **)(pvVar1 + 0x10)) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    (pvVar1,iVar3,(int *)&local_68);
        }
        else {
          *iVar3._M_current = iVar7;
          *(int **)(pvVar1 + 8) = iVar3._M_current + 1;
        }
        iVar7 = *(int *)(*(long *)(local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start + uVar16 * 6) +
                        (long)(int)local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start * 4);
      }
      uVar16 = uVar16 + 1;
    } while (uVar16 < (ulong)((long)iStack_d0._M_current - (long)local_d8 >> 2));
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Farthest paths:",0xf);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
  std::ostream::put(-8);
  std::ostream::flush();
  uVar16 = 0;
  while (iVar7 = V,
        uVar10 = ((long)local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start >> 3) * -0x5555555555555555,
        uVar16 <= uVar10 && uVar10 - uVar16 != 0) {
    poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(int)(uVar16 + 1));
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,": ",2);
    for (pkVar14 = *(key_type **)
                    (local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start + uVar16 * 6);
        pkVar14 !=
        *(key_type **)
         (local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start + uVar16 * 6 + 2); pkVar14 = pkVar14 + 1) {
      pmVar11 = std::
                map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[](&name_abi_cxx11_,pkVar14);
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,(pmVar11->_M_dataplus)._M_p,
                          pmVar11->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,". ",2);
    }
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
    std::ostream::put(-8);
    std::ostream::flush();
    uVar16 = uVar16 + 1;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Farthest paths distribution:",0x1c);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
  std::ostream::put(-8);
  std::ostream::flush();
  iVar12 = (int)local_e8;
  if (-1 < iVar12) {
    lVar18 = 8;
    uVar16 = 0;
    do {
      iVar17 = (int)uVar16;
      iVar15 = iVar7;
      if (iVar17 < iVar7) {
        iVar15 = iVar17;
      }
      if (*(long *)((long)&((local_48.
                             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->
                           super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                           super__Vector_impl_data._M_start + lVar18) ==
          *(long *)((long)local_48.
                          super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + lVar18 + -8)) {
        iVar15 = iVar7;
      }
      iVar7 = iVar15;
      poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar17);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,": ",2);
      poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
      std::ostream::put((char)poVar9);
      std::ostream::flush();
      uVar16 = uVar16 + 1;
      lVar18 = lVar18 + 0x18;
    } while (iVar12 + 1 != uVar16);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Characters with minimum farthest path:",0x26);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
  std::ostream::put(-8);
  std::ostream::flush();
  pkVar14 = local_48.
            super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start[iVar7].
            super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
  if (pkVar14 !=
      local_48.
      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start[iVar7].super__Vector_base<int,_std::allocator<int>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      pmVar11 = std::
                map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[](&name_abi_cxx11_,pkVar14);
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,(pmVar11->_M_dataplus)._M_p,
                          pmVar11->_M_string_length);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
      std::ostream::put((char)poVar9);
      std::ostream::flush();
      pkVar14 = pkVar14 + 1;
    } while (pkVar14 !=
             local_48.
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[iVar7].
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
            );
  }
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             *)&local_b8);
  if (local_d8 != (int *)0x0) {
    operator_delete(local_d8);
  }
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             *)&local_88);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&local_48);
  return;
}

Assistant:

void calculate_diameter() {
    freopen("diameter.txt", "w", stdout); // output file

    int diameter = 0;
    int current_max = 0;
    double average_max = 0;
    double average_average = 0;
    vector< vector<int> > distribution(V, vector<int> (0));
    vector< vector<int> > max_path;
    vector<int> farthest_node;
    for (int i = 0; i < V; i++) {
        vector<int> distance_to(V, 0);
        vector<int> path(V,-1);
        usedbfs.clear();
        usedbfs.resize(V, false);
        bfs(i, distance_to, path);
        current_max = 0;
        for (int j = 0; j < V; j++) {
            average_average += distance_to[j];

            if (distance_to[j] > current_max)
                current_max = distance_to[j];

            if (distance_to[j] > diameter) {
                diameter = distance_to[j];
                farthest_node.clear();
                max_path.clear();
                max_path.push_back(path);
                farthest_node.push_back(j);
            } else if (distance_to[j] == diameter){
                max_path.push_back(path);
                farthest_node.push_back(j);
            }
        }
        average_max += current_max;
        distribution[current_max].push_back(i);
    }
    average_max /= V;
    average_average /= V*V;

    cout << "Diameter: " << diameter << endl;
    cout << "Average path: " << average_average << endl;
    cout << "Average farthest path: " << average_max << endl;

    vector < vector<int> > farthest_path;

    for (int i = 0; i < farthest_node.size(); i++) {
        farthest_path.push_back(vector<int>());
        for (int u = farthest_node[i]; u != -1; u = max_path[i][u])
            farthest_path[i].push_back(u);
    }

    cout << "Farthest paths:" << endl;
    for (int i = 0; i < farthest_path.size(); i++) {
        cout << i+1 << ": ";
        for (vector<int>::iterator j = farthest_path[i].begin(); j != farthest_path[i].end(); j++)
            cout << name[*j] << ". ";
        cout << endl;
    }

    int minimum = V;
    cout << "Farthest paths distribution:" << endl;
    for (int i = 0; i <= diameter; i++) {
        if (distribution[i].size() != 0 && i < minimum)
            minimum = i;

        cout << i << ": " << distribution[i].size() << endl;
    }

    cout << "Characters with minimum farthest path:" << endl;
    for (vector<int>::iterator i = distribution[minimum].begin(); i != distribution[minimum].end(); i++) {
        cout << name[*i] << endl;
    }
}